

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportInstallFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  cmMakefile *this_00;
  bool bVar1;
  cmFileSet *pcVar2;
  bool bVar3;
  byte bVar4;
  cmake *cmakeInstance;
  mapped_type *ppcVar5;
  string *psVar6;
  ostream *poVar7;
  WrapQuotes wrapQuotes;
  pointer config;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view separator;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  char local_2b9;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmFileSet *fileSet_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  cmExportInstallFileGenerator *local_250;
  string *local_248;
  string unescapedDest;
  cmGeneratorExpression ge;
  string local_208 [32];
  string local_1e8;
  string dest;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fileSet_local = fileSet;
  local_250 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,gte->Makefile,IncludeEmptyConfig);
  cmakeInstance = cmMakefile::GetCMakeInstance(gte->Makefile);
  local_268.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_268.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_268);
  cmGeneratorExpression::cmGeneratorExpression(&ge,cmakeInstance,(cmListFileBacktrace *)&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ppcVar5 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&fileSet_local);
  std::__cxx11::string::string
            (local_208,(string *)&((*ppcVar5)->super_cmInstallGenerator).Destination);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
  std::__cxx11::string::~string(local_208);
  local_248 = configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_258 = &__return_storage_ptr__->field_2;
  config = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (config == local_248) goto LAB_00495a6d;
    _e = (pointer)local_198;
    local_198[0]._M_local_buf[0] = '\0';
    wrapQuotes = Wrap;
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        gte->LocalGenerator,config,gte,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,(string *)&e);
    std::__cxx11::string::string((string *)&unescapedDest,(string *)psVar6);
    std::__cxx11::string::~string((string *)&e);
    str._M_str = (char *)0x1;
    str._M_len = (size_t)unescapedDest._M_dataplus._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&dest,(cmOutputConverter *)unescapedDest._M_string_length,str,wrapQuotes);
    bVar3 = cmsys::SystemTools::FileIsFullPath(&unescapedDest);
    if (!bVar3) {
      cmStrCat<char_const(&)[19],std::__cxx11::string&>
                ((string *)&e,(char (*) [19])"${_IMPORT_PREFIX}/",&dest);
      std::__cxx11::string::operator=((string *)&dest,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
    }
    pcVar2 = fileSet_local;
    bVar4 = *(byte *)((long)cge._M_t.
                            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                            _M_head_impl + 0x130);
    if (bVar4 == 1) {
      __y._M_str = "CXX_MODULES";
      __y._M_len = 0xb;
      __x._M_str = (fileSet_local->Type)._M_dataplus._M_p;
      __x._M_len = (fileSet_local->Type)._M_string_length;
      bVar3 = std::operator==(__x,__y);
      if (!bVar3) {
        bVar4 = *(byte *)((long)cge._M_t.
                                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                _M_head_impl + 0x130);
        goto LAB_004959b5;
      }
      this_00 = local_250->IEGen->LocalGenerator->Makefile;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar7 = std::operator<<((ostream *)&e,"The \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
      poVar7 = std::operator<<(poVar7,(string *)psVar6);
      poVar7 = std::operator<<(poVar7,"\" target\'s interface file set \"");
      poVar7 = std::operator<<(poVar7,(string *)&fileSet_local->Name);
      poVar7 = std::operator<<(poVar7,"\" of type \"");
      poVar7 = std::operator<<(poVar7,(string *)&pcVar2->Type);
      std::operator<<(poVar7,
                      "\" contains context-sensitive base file entries which is not supported.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_258;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar3 = false;
LAB_00495a40:
      bVar1 = false;
    }
    else {
LAB_004959b5:
      if (((bVar4 & 1) != 0) &&
         ((long)configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
        cmStrCat<char_const(&)[13],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                  ((string *)&e,(char (*) [13])"\"$<$<CONFIG:",config,(char (*) [3])">:",&dest,
                   (char (*) [3])">\"");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &resultVector,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar3 = true;
        goto LAB_00495a40;
      }
      local_1e8._M_dataplus._M_p._0_1_ = 0x22;
      local_2b9 = '\"';
      cmStrCat<char,std::__cxx11::string&,char>((string *)&e,(char *)&local_1e8,&dest,&local_2b9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&resultVector,
                 (string *)&e);
      std::__cxx11::string::~string((string *)&e);
      bVar1 = true;
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&dest);
    std::__cxx11::string::~string((string *)&unescapedDest);
    config = config + 1;
  } while (bVar3);
  if (bVar1) {
LAB_00495a6d:
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(__return_storage_ptr__,&resultVector,separator,(string_view)ZEXT816(0));
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&resultVector);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  cmGeneratorExpression ge(*gte->Makefile->GetCMakeInstance());
  auto cge = ge.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto unescapedDest = cge->Evaluate(gte->LocalGenerator, config, gte);
    auto dest = cmOutputConverter::EscapeForCMake(
      unescapedDest, cmOutputConverter::WrapQuotes::NoWrap);
    if (!cmSystemTools::FileIsFullPath(unescapedDest)) {
      dest = cmStrCat("${_IMPORT_PREFIX}/", dest);
    }

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (cge->GetHadContextSensitiveCondition() && type == "CXX_MODULES"_s) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    if (cge->GetHadContextSensitiveCondition() && configs.size() != 1) {
      resultVector.push_back(
        cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
    } else {
      resultVector.emplace_back(cmStrCat('"', dest, '"'));
      break;
    }
  }

  return cmJoin(resultVector, " ");
}